

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::KeyValuePair>,_unsigned_long>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::InnerMap::FindHelper
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::KeyValuePair>,_unsigned_long>
           *__return_storage_ptr__,InnerMap *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,TreeIterator *it)

{
  char *__s2;
  void **ppvVar1;
  size_t sVar2;
  size_t __n;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *this_00;
  int iVar3;
  long lVar4;
  LogMessage *other;
  iterator tree_it;
  char *pcVar5;
  ulong uVar6;
  char cVar7;
  Node *pNVar8;
  unsigned_long index;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  LogMessage local_68;
  
  __s2 = (k->_M_dataplus)._M_p;
  cVar7 = *__s2;
  if (cVar7 == '\0') {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    pcVar5 = __s2;
    do {
      pcVar5 = pcVar5 + 1;
      lVar4 = (long)cVar7 + lVar4 * 5;
      cVar7 = *pcVar5;
    } while (cVar7 != '\0');
  }
  index = this->num_buckets_ - 1 & (this->seed_ | 1) * lVar4;
  ppvVar1 = this->table_;
  pNVar8 = (Node *)ppvVar1[index];
  if (pNVar8 != (Node *)0x0) {
    uVar6 = index ^ 1;
    if (pNVar8 == (Node *)ppvVar1[uVar6]) {
      if ((pNVar8 != (Node *)0x0) && (pNVar8 == (Node *)ppvVar1[uVar6])) {
        if (pNVar8 != (Node *)ppvVar1[uVar6]) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                     ,0x27c);
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        index = index & 0xfffffffffffffffe;
        this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                   *)this->table_[index];
        local_70 = k;
        tree_it = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                  ::find(this_00,&local_70);
        if ((_Rb_tree_header *)tree_it._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
          if (it != (TreeIterator *)0x0) {
            it->_M_node = tree_it._M_node;
          }
          iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::KeyValuePair>
          ::iterator_base(&__return_storage_ptr__->first,(TreeIterator)tree_it._M_node,this,index);
          goto LAB_004c97a7;
        }
      }
    }
    else {
      sVar2 = k->_M_string_length;
      do {
        __n = (pNVar8->kv).k_._M_string_length;
        if (__n == sVar2) {
          if (__n == 0) {
            bVar9 = true;
          }
          else {
            iVar3 = bcmp((pNVar8->kv).k_._M_dataplus._M_p,__s2,__n);
            bVar9 = iVar3 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          (__return_storage_ptr__->first).node_ = pNVar8;
          (__return_storage_ptr__->first).m_ = this;
          (__return_storage_ptr__->first).bucket_index_ = index;
          __return_storage_ptr__->second = index;
          break;
        }
        pNVar8 = pNVar8->next;
      } while (pNVar8 != (Node *)0x0);
      if (bVar9) {
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->first).node_ = (Node *)0x0;
  (__return_storage_ptr__->first).m_ = (InnerMap *)0x0;
  (__return_storage_ptr__->first).bucket_index_ = 0;
LAB_004c97a7:
  __return_storage_ptr__->second = index;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const Key& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (IsMatch(*KeyPtrFromNodePtr(node), k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != NULL);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        Key* key = const_cast<Key*>(&k);
        typename Tree::iterator tree_it = tree->find(key);
        if (tree_it != tree->end()) {
          if (it != NULL) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }